

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry>::
emplace_back<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry>
          (SmallVectorBase<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry> *this,
          BindEntry *args)

{
  undefined8 *puVar1;
  SyntaxNode **ppSVar2;
  ulong uVar3;
  ModuleDeclarationSyntax *pMVar4;
  BindDirectiveSyntax *pBVar5;
  SyntaxNode *pSVar6;
  SyntaxNode *pSVar7;
  SyntaxNode *pSVar8;
  pointer ppSVar9;
  undefined8 uVar10;
  reference pBVar11;
  reference extraout_RAX;
  BindEntry *ctx;
  ulong uVar12;
  BindEntry *other;
  long lVar13;
  reference pBVar14;
  BindEntry *this_00;
  
  uVar3 = *(ulong *)(this + 8);
  this_00 = (BindEntry *)(*(long *)this + uVar3 * 0x80);
  if (uVar3 == *(ulong *)(this + 0x10)) {
    if (uVar3 == 0xffffffffffffff) {
      detail::throwLengthError();
    }
    uVar12 = uVar3 + 1;
    if (uVar3 + 1 < uVar3 * 2) {
      uVar12 = uVar3 * 2;
    }
    if (0xffffffffffffff - uVar3 < uVar3) {
      uVar12 = 0xffffffffffffff;
    }
    pBVar11 = (reference)operator_new(uVar12 << 7);
    ctx = args;
    SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
              ((SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *)(pBVar11 + uVar3),
               (Base *)args);
    pMVar4 = args->definitionTarget;
    pBVar5 = (args->info).bindSyntax;
    pSVar6 = (args->info).configRuleSyntax;
    pSVar7 = (args->info).configBlockSyntax;
    pSVar8 = (args->info).instantiationDefSyntax;
    ppSVar9 = (args->info).liblist._M_ptr;
    uVar10 = *(undefined8 *)((long)&(args->info).liblist._M_extent._M_extent_value + 1);
    puVar1 = (undefined8 *)((long)&pBVar11[uVar3].info.liblist._M_ptr + 1);
    *puVar1 = *(undefined8 *)((long)&(args->info).liblist._M_ptr + 1);
    puVar1[1] = uVar10;
    ppSVar2 = &pBVar11[uVar3].info.instantiationDefSyntax;
    *ppSVar2 = pSVar8;
    ((span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *)(ppSVar2 + 1))->_M_ptr =
         ppSVar9;
    ppSVar2 = &pBVar11[uVar3].info.configRuleSyntax;
    *ppSVar2 = pSVar6;
    ppSVar2[1] = pSVar7;
    pBVar11[uVar3].definitionTarget = pMVar4;
    ((BindDirectiveInfo *)(&pBVar11[uVar3].definitionTarget + 1))->bindSyntax = pBVar5;
    other = *(BindEntry **)this;
    lVar13 = *(long *)(this + 8);
    if (other + lVar13 == this_00) {
      pBVar14 = pBVar11;
      if (lVar13 != 0) {
        do {
          ctx = other;
          SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
                    ((SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *)pBVar14,
                     (Base *)other);
          pMVar4 = other->definitionTarget;
          pBVar5 = (other->info).bindSyntax;
          pSVar6 = (other->info).configRuleSyntax;
          pSVar7 = (other->info).configBlockSyntax;
          pSVar8 = (other->info).instantiationDefSyntax;
          ppSVar9 = (other->info).liblist._M_ptr;
          uVar10 = *(undefined8 *)((long)&(other->info).liblist._M_extent._M_extent_value + 1);
          *(undefined8 *)((long)&(pBVar14->info).liblist._M_ptr + 1) =
               *(undefined8 *)((long)&(other->info).liblist._M_ptr + 1);
          *(undefined8 *)((long)&(pBVar14->info).liblist._M_extent._M_extent_value + 1) = uVar10;
          (pBVar14->info).instantiationDefSyntax = pSVar8;
          (pBVar14->info).liblist._M_ptr = ppSVar9;
          (pBVar14->info).configRuleSyntax = pSVar6;
          (pBVar14->info).configBlockSyntax = pSVar7;
          pBVar14->definitionTarget = pMVar4;
          (pBVar14->info).bindSyntax = pBVar5;
          other = other + 1;
          pBVar14 = pBVar14 + 1;
        } while (other != this_00);
      }
    }
    else {
      pBVar14 = pBVar11;
      if (other != this_00) {
        do {
          ctx = other;
          SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
                    ((SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *)pBVar14,
                     (Base *)other);
          pMVar4 = other->definitionTarget;
          pBVar5 = (other->info).bindSyntax;
          pSVar6 = (other->info).configRuleSyntax;
          pSVar7 = (other->info).configBlockSyntax;
          pSVar8 = (other->info).instantiationDefSyntax;
          ppSVar9 = (other->info).liblist._M_ptr;
          uVar10 = *(undefined8 *)((long)&(other->info).liblist._M_extent._M_extent_value + 1);
          *(undefined8 *)((long)&(pBVar14->info).liblist._M_ptr + 1) =
               *(undefined8 *)((long)&(other->info).liblist._M_ptr + 1);
          *(undefined8 *)((long)&(pBVar14->info).liblist._M_extent._M_extent_value + 1) = uVar10;
          (pBVar14->info).instantiationDefSyntax = pSVar8;
          (pBVar14->info).liblist._M_ptr = ppSVar9;
          (pBVar14->info).configRuleSyntax = pSVar6;
          (pBVar14->info).configBlockSyntax = pSVar7;
          pBVar14->definitionTarget = pMVar4;
          (pBVar14->info).bindSyntax = pBVar5;
          other = other + 1;
          pBVar14 = pBVar14 + 1;
        } while (other != this_00);
        other = *(BindEntry **)this;
        lVar13 = *(long *)(this + 8);
      }
      if (other + lVar13 != this_00) {
        pBVar14 = pBVar11 + uVar3;
        do {
          ctx = this_00;
          SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
                    ((SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *)(pBVar14 + 1),
                     (Base *)this_00);
          pMVar4 = this_00->definitionTarget;
          pBVar5 = (this_00->info).bindSyntax;
          pSVar6 = (this_00->info).configRuleSyntax;
          pSVar7 = (this_00->info).configBlockSyntax;
          pSVar8 = (this_00->info).instantiationDefSyntax;
          ppSVar9 = (this_00->info).liblist._M_ptr;
          uVar10 = *(undefined8 *)((long)&(this_00->info).liblist._M_extent._M_extent_value + 1);
          *(undefined8 *)((long)&pBVar14[1].info.liblist._M_ptr + 1) =
               *(undefined8 *)((long)&(this_00->info).liblist._M_ptr + 1);
          *(undefined8 *)((long)&pBVar14[1].info.liblist._M_extent._M_extent_value + 1) = uVar10;
          pBVar14[1].info.instantiationDefSyntax = pSVar8;
          pBVar14[1].info.liblist._M_ptr = ppSVar9;
          pBVar14[1].info.configRuleSyntax = pSVar6;
          pBVar14[1].info.configBlockSyntax = pSVar7;
          pBVar14[1].definitionTarget = pMVar4;
          pBVar14[1].info.bindSyntax = pBVar5;
          this_00 = this_00 + 1;
          pBVar14 = pBVar14 + 1;
        } while (this_00 != other + lVar13);
      }
    }
    SmallVectorBase<BindEntry>::cleanup((SmallVectorBase<BindEntry> *)this,(EVP_PKEY_CTX *)ctx);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar12;
    *(reference *)this = pBVar11;
  }
  else {
    SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
              ((SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *)this_00,(Base *)args);
    pMVar4 = args->definitionTarget;
    pBVar5 = (args->info).bindSyntax;
    pSVar6 = (args->info).configRuleSyntax;
    pSVar7 = (args->info).configBlockSyntax;
    pSVar8 = (args->info).instantiationDefSyntax;
    ppSVar9 = (args->info).liblist._M_ptr;
    uVar10 = *(undefined8 *)((long)&(args->info).liblist._M_extent._M_extent_value + 1);
    *(undefined8 *)((long)&(this_00->info).liblist._M_ptr + 1) =
         *(undefined8 *)((long)&(args->info).liblist._M_ptr + 1);
    *(undefined8 *)((long)&(this_00->info).liblist._M_extent._M_extent_value + 1) = uVar10;
    (this_00->info).instantiationDefSyntax = pSVar8;
    (this_00->info).liblist._M_ptr = ppSVar9;
    (this_00->info).configRuleSyntax = pSVar6;
    (this_00->info).configBlockSyntax = pSVar7;
    this_00->definitionTarget = pMVar4;
    (this_00->info).bindSyntax = pBVar5;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    pBVar11 = extraout_RAX;
  }
  return pBVar11;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }